

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::PathTypeHandlerBase::PathTypeHandlerBase
          (PathTypeHandlerBase *this,TypePath *typePath,uint16 pathLength,PropertyIndex slotCapacity
          ,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,bool isLocked,bool isShared,
          DynamicType *predecessorType)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  PathTypeHandlerBase *pPVar5;
  undefined6 in_register_0000000a;
  byte bVar6;
  
  bVar6 = 0x18;
  if (!isShared) {
    bVar6 = 0;
  }
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,(int)CONCAT62(in_register_0000000a,slotCapacity),
             inlineSlotCapacity,offsetOfInlineSlots,(bVar6 | isLocked << 2) + 1);
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01552440
  ;
  Memory::Recycler::WBSetBit((char *)&this->predecessorType);
  (this->predecessorType).ptr = predecessorType;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->predecessorType);
  Memory::Recycler::WBSetBit((char *)&this->typePath);
  (this->typePath).ptr = typePath;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->typePath);
  (this->successorInfo).ptr = (PathTypeSuccessorInfo *)0x0;
  this->hasUserDefinedCtor = false;
  this->hasInternalProperty = false;
  if (slotCapacity < pathLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xf2,"(pathLength <= slotCapacity)","pathLength <= slotCapacity");
    if (!bVar2) goto LAB_00dce00f;
    *puVar4 = 0;
  }
  if (slotCapacity < inlineSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xf3,"(inlineSlotCapacity <= slotCapacity)",
                                "inlineSlotCapacity <= slotCapacity");
    if (!bVar2) {
LAB_00dce00f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  (this->super_DynamicTypeHandler).unusedBytes = pathLength * 2 + 1;
  if (predecessorType != (DynamicType *)0x0) {
    iVar3 = (*((predecessorType->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x4e])();
    if (iVar3 != 0) {
      pPVar5 = FromTypeHandler((predecessorType->typeHandler).ptr);
      this->hasUserDefinedCtor = pPVar5->hasUserDefinedCtor;
      this->hasInternalProperty = pPVar5->hasInternalProperty;
    }
  }
  return;
}

Assistant:

PathTypeHandlerBase::PathTypeHandlerBase(TypePath* typePath, uint16 pathLength, const PropertyIndex slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared, DynamicType* predecessorType) :
        DynamicTypeHandler(slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, DefaultFlags | (isLocked ? IsLockedFlag : 0) | (isShared ? (MayBecomeSharedFlag | IsSharedFlag) : 0)),
        typePath(typePath),
        predecessorType(predecessorType),
        successorInfo(nullptr),
        hasUserDefinedCtor(false),
        hasInternalProperty(false)
    {
        Assert(pathLength <= slotCapacity);
        Assert(inlineSlotCapacity <= slotCapacity);
        SetUnusedBytesValue(pathLength);

        if (predecessorType != nullptr && predecessorType->GetTypeHandler()->IsPathTypeHandler())
        {
            auto* handler = PathTypeHandlerBase::FromTypeHandler(predecessorType->GetTypeHandler());
            hasUserDefinedCtor = handler->hasUserDefinedCtor;
            hasInternalProperty = handler->hasInternalProperty;
        }
    }